

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_encoder.cc
# Opt level: O1

bool __thiscall
draco::SequentialAttributeEncoder::SetPredictionSchemeParentAttributes
          (SequentialAttributeEncoder *this,PredictionSchemeInterface *ps)

{
  PointCloud *pPVar1;
  int iVar2;
  Type TVar3;
  int32_t parent_att_id;
  PointAttribute *pPVar4;
  bool bVar5;
  uint uVar6;
  
  iVar2 = (*ps->_vptr_PredictionSchemeInterface[5])(ps);
  bVar5 = iVar2 < 1;
  if (0 < iVar2) {
    pPVar1 = this->encoder_->point_cloud_;
    TVar3 = (*ps->_vptr_PredictionSchemeInterface[6])(ps,0);
    parent_att_id = PointCloud::GetNamedAttributeId(pPVar1,TVar3);
    if (parent_att_id != -1) {
      uVar6 = 1;
      do {
        pPVar4 = PointCloudEncoder::GetPortableAttribute(this->encoder_,parent_att_id);
        iVar2 = (*ps->_vptr_PredictionSchemeInterface[7])(ps,pPVar4);
        if ((char)iVar2 == '\0') {
          return bVar5;
        }
        iVar2 = (*ps->_vptr_PredictionSchemeInterface[5])(ps);
        bVar5 = iVar2 <= (int)uVar6;
        if (iVar2 <= (int)uVar6) {
          return bVar5;
        }
        pPVar1 = this->encoder_->point_cloud_;
        TVar3 = (*ps->_vptr_PredictionSchemeInterface[6])(ps,(ulong)uVar6);
        parent_att_id = PointCloud::GetNamedAttributeId(pPVar1,TVar3);
        uVar6 = uVar6 + 1;
      } while (parent_att_id != -1);
    }
  }
  return bVar5;
}

Assistant:

bool SequentialAttributeEncoder::SetPredictionSchemeParentAttributes(
    PredictionSchemeInterface *ps) {
  for (int i = 0; i < ps->GetNumParentAttributes(); ++i) {
    const int att_id = encoder_->point_cloud()->GetNamedAttributeId(
        ps->GetParentAttributeType(i));
    if (att_id == -1) {
      return false;  // Requested attribute does not exist.
    }
    if (!ps->SetParentAttribute(encoder_->GetPortableAttribute(att_id))) {
      return false;
    }
  }
  return true;
}